

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLiNois.cpp
# Opt level: O0

void __thiscall NaLinearNoiseGen::NaLinearNoiseGen(NaLinearNoiseGen *this,uint nChainLen)

{
  NaLinearUnit *pNVar1;
  undefined8 *in_RDI;
  uint in_stack_0000000c;
  NaLinearUnitsChain *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  NaConfigPart *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  char *szInstance;
  NaUnit *in_stack_ffffffffffffffd0;
  NaRandomSequence *this_00;
  
  NaUnit::NaUnit(in_stack_ffffffffffffffd0,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                 (uint)in_stack_ffffffffffffffc8,(uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  NaConfigPart::NaConfigPart
            (in_stack_ffffffffffffffc0,
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *in_RDI = &PTR_PrintLog_00194290;
  in_RDI[4] = &PTR__NaLinearNoiseGen_00194310;
  this_00 = (NaRandomSequence *)(in_RDI + 8);
  NaRandomSequence::NaRandomSequence(this_00);
  szInstance = (char *)(in_RDI + 0x11);
  NaLinearUnitsChain::NaLinearUnitsChain(in_stack_00000010,in_stack_0000000c);
  pNVar1 = NaDynAr<NaLinearUnit>::operator[]
                     ((NaDynAr<NaLinearUnit> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  pNVar1->act = true;
  NaConfigPart::SetInstance((NaConfigPart *)this_00,szInstance);
  NaConfigPart::SetInstance((NaConfigPart *)this_00,szInstance);
  return;
}

Assistant:

NaLinearNoiseGen::NaLinearNoiseGen (unsigned nChainLen)
:   LinChain(nChainLen), NaConfigPart("LinearNoiseGenerator")
{
    // Linear chain initialization
    LinChain[0].act = true;
    RandSeq.SetInstance("InLinearNoiseGenerator");
    LinChain.SetInstance("InLinearNoiseGenerator");
}